

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.cpp
# Opt level: O0

void __thiscall Render::parseTileset(Render *this,SDL_Surface *_tileset)

{
  SDL_Surface *pSVar1;
  int local_8c [2];
  SDL_Rect cut_4;
  int i_4;
  SDL_Rect cut_3;
  int j_3;
  int i_3;
  SDL_Rect cut_2;
  int j_2;
  int i_2;
  SDL_Rect cut_1;
  int j_1;
  int i_1;
  SDL_Rect cut;
  int j;
  int i;
  SDL_Surface *_tileset_local;
  Render *this_local;
  
  for (cut.h = 0; cut.h < 10; cut.h = cut.h + 1) {
    for (cut.w = 0; cut.w < 8; cut.w = cut.w + 1) {
      j_1 = cut.h * 0x18;
      i_1 = cut.w << 4;
      cut.x = 0x18;
      cut.y = 0x10;
      pSVar1 = (SDL_Surface *)SDL_CreateRGBSurface(0,0x18,0x10,0x20,0xff0000,0xff00,0xff,0xff000000)
      ;
      this->blockBitmap[cut.h * 8 + cut.w] = pSVar1;
      SDL_UpperBlit(_tileset,&j_1,this->blockBitmap[cut.h * 8 + cut.w],0);
    }
  }
  for (cut_1.h = 0; cut_1.h < 3; cut_1.h = cut_1.h + 1) {
    for (cut_1.w = 0; cut_1.w < 2; cut_1.w = cut_1.w + 1) {
      j_2 = cut_1.h << 3;
      i_2 = cut_1.w * 8 + 0x90;
      cut_1.x = 8;
      cut_1.y = 8;
      pSVar1 = (SDL_Surface *)SDL_CreateRGBSurface(0,8,8,0x20,0xff0000,0xff00,0xff,0xff000000);
      this->ballBitmap[cut_1.h * 2 + cut_1.w] = pSVar1;
      SDL_UpperBlit(_tileset,&j_2,this->ballBitmap[cut_1.h * 2 + cut_1.w],0);
    }
  }
  for (cut_2.h = 0; cut_2.h < 2; cut_2.h = cut_2.h + 1) {
    for (cut_2.w = 0; cut_2.w < 2; cut_2.w = cut_2.w + 1) {
      j_3 = cut_2.h * 0x30 + 0x18;
      i_3 = cut_2.w * 8 + 0x90;
      cut_2.x = 0x30;
      cut_2.y = 8;
      pSVar1 = (SDL_Surface *)SDL_CreateRGBSurface(0,0x30,8,0x20,0xff0000,0xff00,0xff,0xff000000);
      this->paletteBitmap[cut_2.h * 2 + cut_2.w] = pSVar1;
      SDL_UpperBlit(_tileset,&j_3,this->paletteBitmap[cut_2.h * 2 + cut_2.w],0);
    }
  }
  for (cut_3.h = 0; cut_3.h < 2; cut_3.h = cut_3.h + 1) {
    for (cut_3.w = 0; cut_3.w < 2; cut_3.w = cut_3.w + 1) {
      cut_4.h = cut_3.h * 0x60;
      pSVar1 = (SDL_Surface *)SDL_CreateRGBSurface(0,0x60,8,0x20,0xff0000,0xff00,0xff,0xff000000);
      this->paletteBitmap[cut_3.h * 2 + cut_3.w + 4] = pSVar1;
      SDL_UpperBlit(_tileset,&cut_4.h,this->paletteBitmap[cut_3.h * 2 + cut_3.w + 4],0);
    }
  }
  for (cut_4.w = 0; cut_4.w < 8; cut_4.w = cut_4.w + 1) {
    local_8c[0] = cut_4.w * 0x10 + 0x78;
    local_8c[1] = 0x90;
    cut_4.x = 0x10;
    cut_4.y = 0x10;
    pSVar1 = (SDL_Surface *)SDL_CreateRGBSurface(0,0x10,0x10,0x20,0xff0000,0xff00,0xff,0xff000000);
    this->iconBitmap[cut_4.w] = pSVar1;
    SDL_UpperBlit(_tileset,local_8c,this->iconBitmap[cut_4.w],0);
  }
  return;
}

Assistant:

void Render::parseTileset(SDL_Surface *_tileset){
    // Get blocks
    for(int i=0; i<10; i++){
        for(int j=0; j<8; j++){
            SDL_Rect cut;
            cut.x = i*BLOCK_W;
            cut.y = j*BLOCK_H;
            cut.w = BLOCK_W;
            cut.h = BLOCK_H;
            blockBitmap[i*8 + j] = SDL_CreateRGBSurface(0, cut.w, cut.h, 32, 0x00FF0000, 0x0000FF00, 0x000000FF, 0xFF000000);
            SDL_BlitSurface(_tileset, &cut, blockBitmap[i*8 + j], nullptr);
        }
    }

    // Get balls
    for(int i=0; i<3; i++){
        for(int j=0; j<2; j++){
            SDL_Rect cut;
            cut.x = i*BALL_W;
            cut.y = j*BALL_H + 144;
            cut.w = BALL_W;
            cut.h = BALL_H;
            ballBitmap[i*2 + j] = SDL_CreateRGBSurface(0, cut.w, cut.h, 32, 0x00FF0000, 0x0000FF00, 0x000000FF, 0xFF000000);
            SDL_BlitSurface(_tileset, &cut, ballBitmap[i*2 + j], nullptr);
        }
    }

    // Get small palettes
    for(int i=0; i<2; i++){
        for(int j=0; j<2; j++){
            SDL_Rect cut;
            cut.x = i*PALETTE_SW + 24;
            cut.y = j*PALETTE_SH + 144;
            cut.w = PALETTE_SW;
            cut.h = PALETTE_SH;
            paletteBitmap[i*2 + j] = SDL_CreateRGBSurface(0, cut.w, cut.h, 32, 0x00FF0000, 0x0000FF00, 0x000000FF, 0xFF000000);
            SDL_BlitSurface(_tileset, &cut, paletteBitmap[i*2 + j], nullptr);
        }
    }

    // Get big palettes
    for(int i=0; i<2; i++){
        for(int j=0; j<2; j++){
            SDL_Rect cut;
            cut.x = i*PALETTE_BW;
            cut.y = j*PALETTE_BH + 128;
            cut.w = PALETTE_BW;
            cut.h = PALETTE_BH;
            paletteBitmap[i*2 + j + 4] = SDL_CreateRGBSurface(0, cut.w, cut.h, 32, 0x00FF0000, 0x0000FF00, 0x000000FF, 0xFF000000);
            SDL_BlitSurface(_tileset, &cut, paletteBitmap[i*2 + j + 4], nullptr);
        }
    }

    // Get icons
    for(int i=0; i<8; i++){
        SDL_Rect cut;
        cut.x = i*ICON_W + 120;
        cut.y = 144;
        cut.w = ICON_W;
        cut.h = ICON_H;
        iconBitmap[i] = SDL_CreateRGBSurface(0, cut.w, cut.h, 32, 0x00FF0000, 0x0000FF00, 0x000000FF, 0xFF000000);
        SDL_BlitSurface(_tileset, &cut, iconBitmap[i], nullptr);
    }
}